

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_A_Light1(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  DObject *this_00;
  bool bVar1;
  bool local_4e;
  bool local_4b;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x527,"int AF_A_Light1(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    this = (DObject *)(param->field_0).field_1.a;
    local_4b = true;
    if (this != (DObject *)0x0) {
      local_4b = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_4b != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar1 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
          bVar1 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x527,"int AF_A_Light1(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
        this_00 = (DObject *)param[1].field_0.field_1.a;
        local_4e = true;
        if (this_00 != (DObject *)0x0) {
          local_4e = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        }
        if (local_4e == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x527,"int AF_A_Light1(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar1 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
          bVar1 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x527,"int AF_A_Light1(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      if (*(long *)&this[0xc].ObjectFlags != 0) {
        *(undefined4 *)(*(long *)&this[0xc].ObjectFlags + 0x138) = 1;
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x527,"int AF_A_Light1(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x527,"int AF_A_Light1(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AInventory, A_Light1)
{
	PARAM_ACTION_PROLOGUE;

	if (self->player != NULL)
	{
		self->player->extralight = 1;
	}
	return 0;
}